

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
* __thiscall
Graph::random_two_bridges_search
          (vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
           *__return_storage_ptr__,Graph *this,bool recursive)

{
  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_> _Var1;
  undefined7 in_register_00000011;
  __normal_iterator<Graph::Edge_*,_std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>_> __args;
  vector<Graph::Edge,_std::allocator<Graph::Edge>_> copy;
  Bridges bridges;
  _Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_> local_60;
  _Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_> local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clear(this);
  if ((int)CONCAT71(in_register_00000011,recursive) == 0) {
    dfsForRandomIterative(this);
  }
  else {
    dfsForRandomRecursive(this,0);
  }
  std::vector<Graph::Edge,_std::allocator<Graph::Edge>_>::vector
            ((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&local_60,&this->edges);
  srs::radixSort((vector<Graph::Edge,_std::allocator<Graph::Edge>_> *)&local_60);
  __args._M_current = local_60._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__args._M_current == local_60._M_impl.super__Vector_impl_data._M_finish) {
LAB_0010306f:
      std::_Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>::~_Vector_base(&local_60);
      return __return_storage_ptr__;
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Var1 = std::
            __adjacent_find<__gnu_cxx::__normal_iterator<Graph::Edge*,std::vector<Graph::Edge,std::allocator<Graph::Edge>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (__args._M_current);
    __args = _Var1;
    if (_Var1._M_current == local_60._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::~_Vector_base
                (&local_48);
      goto LAB_0010306f;
    }
    for (; (__args._M_current != local_60._M_impl.super__Vector_impl_data._M_finish &&
           ((__args._M_current)->shift == (_Var1._M_current)->shift));
        __args._M_current = __args._M_current + 1) {
      std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
      emplace_back<unsigned_long&,unsigned_long&>
                ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&local_48,
                 (unsigned_long *)__args._M_current,&((__args._M_current)->super_LightEdge).v);
    }
    std::
    vector<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>,_std::allocator<std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)&local_48);
    std::_Vector_base<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::~_Vector_base(&local_48)
    ;
  } while( true );
}

Assistant:

std::vector<Graph::Bridges> Graph::random_two_bridges_search(bool recursive) {
    std::vector<Graph::Bridges> out;
    clear();

    if (recursive)
        dfsForRandomRecursive(0);
    else
        dfsForRandomIterative();

    auto copy = edges;
    srs::radixSort(copy);

    for (auto it = copy.begin(), jt = it; it != copy.end(); jt = it) {
        Graph::Bridges bridges;

        jt = it = std::adjacent_find(jt, copy.end());

        if (jt == copy.end())
            break;

        while (it != copy.end() && *it == *jt) {
            bridges.emplace_back(it->u, it->v);
            ++it;
        }

        out.push_back(bridges);
    }

    return out;
}